

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O1

void __thiscall TestClass::~TestClass(TestClass *this)

{
  (this->super_TimerListener)._vptr_TimerListener = (_func_int **)&PTR_onTimeout_00105ac8;
  if (this->mEvent1Handler != (EventMethod<TestClass,_Event1> *)0x0) {
    (*(this->mEvent1Handler->super_IEventListener)._vptr_IEventListener[2])();
  }
  if (this->mEvent2Handler != (EventMethod<TestClass,_Event2> *)0x0) {
    (*(this->mEvent2Handler->super_IEventListener)._vptr_IEventListener[2])();
  }
  if (this->mEvent3Handler != (EventMethod<TestClass,_Event3> *)0x0) {
    (*(this->mEvent3Handler->super_IEventListener)._vptr_IEventListener[2])();
  }
  EventDispatcher::removeAll();
  TimerManager::destroyManager();
  SmartPtr<AsyncEventAgent>::~SmartPtr(&this->mPeriodEvent);
  Selector::~Selector(&this->mThread);
  return;
}

Assistant:

TestClass::~TestClass()
{
	delete mEvent1Handler;
	delete mEvent2Handler;
	delete mEvent3Handler;
	
	mThread.removeAll();
	TimerManager::destroyManager();
}